

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::DallasReadBlock(AmpIO *this,uchar *data,uint nbytes)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  nodeaddr_t address;
  uint nbytes_local;
  uchar *data_local;
  AmpIO *this_local;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x64524131) {
    this_local._7_1_ = false;
  }
  else if (nbytes < 0x101) {
    if ((this->super_FpgaIO).super_BoardIO.port == (BasePort *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      iVar3 = (*pBVar1->_vptr_BasePort[0x26])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0x6000,data,
                         (ulong)nbytes);
      this_local._7_1_ = (bool)((byte)iVar3 & 1);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::DallasReadBlock(unsigned char *data, unsigned int nbytes) const
{
    if (GetHardwareVersion() == dRA1_String)
        return false;

    nodeaddr_t address = 0x6000;
    if (nbytes > 256)
        return false;
    if (port)
        return port->ReadBlock(BoardId, address, reinterpret_cast<quadlet_t *>(data), nbytes);
    return false;
}